

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::AddAllNodes
          (ChContactSurfaceNodeCloud *this,double point_radius)

{
  ChMesh *pCVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint uVar6;
  ulong uVar7;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  double local_58;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_50;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_40;
  
  if (((this->super_ChContactSurface).m_mesh != (ChMesh *)0x0) &&
     (local_58 = point_radius,
     iVar2 = (*(((this->super_ChContactSurface).m_mesh)->super_ChIndexedNodes).super_ChPhysicsItem.
               super_ChObj._vptr_ChObj[0x3c])(), iVar2 != 0)) {
    uVar7 = 0;
    do {
      pCVar1 = (this->super_ChContactSurface).m_mesh;
      (*(pCVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                (&local_68,pCVar1,uVar7);
      if (local_68 == 0) {
        peVar4 = (element_type *)0x0;
      }
      else {
        peVar4 = (element_type *)
                 __dynamic_cast(local_68,&ChNodeBase::typeinfo,&ChNodeFEAxyz::typeinfo,
                                0xffffffffffffffff);
      }
      if (peVar4 == (element_type *)0x0) {
        peVar4 = (element_type *)0x0;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        this_01 = local_60;
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_60->_M_use_count = local_60->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_60->_M_use_count = local_60->_M_use_count + 1;
          }
        }
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (peVar4 == (element_type *)0x0) {
        pCVar1 = (this->super_ChContactSurface).m_mesh;
        (*(pCVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                  (&local_68,pCVar1,uVar7);
        if (local_68 == 0) {
          peVar5 = (element_type *)0x0;
        }
        else {
          peVar5 = (element_type *)
                   __dynamic_cast(local_68,&ChNodeBase::typeinfo,&ChNodeFEAxyzrot::typeinfo,
                                  0xffffffffffffffff);
        }
        if (peVar5 == (element_type *)0x0) {
          peVar5 = (element_type *)0x0;
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          this_00._M_pi = local_60;
          if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_60->_M_use_count = local_60->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_60->_M_use_count = local_60->_M_use_count + 1;
            }
          }
        }
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        }
        if (peVar5 != (element_type *)0x0) {
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            }
          }
          local_50.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar5;
          local_50.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = this_00._M_pi;
          AddNode(this,&local_50,local_58);
          if (local_50.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      else {
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        local_40.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar4;
        local_40.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = this_01;
        AddNode(this,&local_40,local_58);
        this_00._M_pi =
             local_40.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      uVar3 = (*(((this->super_ChContactSurface).m_mesh)->super_ChIndexedNodes).super_ChPhysicsItem.
                super_ChObj._vptr_ChObj[0x3c])();
    } while (uVar6 < uVar3);
  }
  return;
}

Assistant:

void ChContactSurfaceNodeCloud::AddAllNodes(const double point_radius) {
    if (!m_mesh)
        return;
    for (unsigned int i = 0; i < m_mesh->GetNnodes(); ++i)
        if (auto mnodeFEA = std::dynamic_pointer_cast<ChNodeFEAxyz>(m_mesh->GetNode(i)))
            this->AddNode(mnodeFEA, point_radius);
        else if (auto mnodeFEArot = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(m_mesh->GetNode(i)))
            this->AddNode(mnodeFEArot, point_radius);
}